

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::HandleAcksAndSendSubscriptionSyncsAndHeartbeats
          (PixieProvider *this,shared_ptr<bidfx_public_api::tools::Client> *client,int thread_num)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  unique_ptr<bidfx_public_api::price::pixie::AckData,_std::default_delete<bidfx_public_api::price::pixie::AckData>_>
  ack_data;
  AckMessage message;
  __atomic_base<int> local_64;
  undefined1 local_60 [56];
  OutputStream *out;
  
  local_64._M_i = thread_num;
  iVar3 = (*((client->
             super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->_vptr_Client[4])();
  out = (OutputStream *)CONCAT44(extraout_var,iVar3);
  bVar2 = provider::AbstractProvider::IsRunning(&this->super_AbstractProvider);
  if (bVar2) {
    do {
      if (local_64._M_i != (this->writer_thread_count_).super___atomic_base<int>._M_i) break;
      PollNextAck((PixieProvider *)local_60);
      uVar1 = local_60._0_8_;
      if ((_func_int **)local_60._0_8_ == (_func_int **)0x0) {
        TryAndWriteHeartbeat(this,out);
      }
      else {
        AckData::ToAckMessage((AckMessage *)(local_60 + 8),(AckData *)local_60._0_8_);
        WriteMessage(this,(PixieMessage *)(local_60 + 8),out);
      }
      PeriodicallyCheckSubscriptions(this,out);
      if ((_func_int **)uVar1 != (_func_int **)0x0) {
        operator_delete((void *)uVar1,0x28);
      }
      bVar2 = provider::AbstractProvider::IsRunning(&this->super_AbstractProvider);
    } while (bVar2);
  }
  spdlog::logger::log<int>
            (Log,(source_loc)ZEXT816(0x1c4d25),debug,"writer {} finished",&local_64._M_i);
  return;
}

Assistant:

void PixieProvider::HandleAcksAndSendSubscriptionSyncsAndHeartbeats(std::shared_ptr<Client> client, int thread_num)
{
    OutputStream& out = client -> GetOutputStream();
    while (IsRunning() && thread_num == writer_thread_count_)
    {
        try
        {
            std::unique_ptr<AckData> ack_data = PollNextAck();

            if (ack_data != nullptr)
            {
                AckMessage message = ack_data->ToAckMessage();
                WriteMessage(message, out);
            }
            else
            {
                TryAndWriteHeartbeat(out);
            }

            PeriodicallyCheckSubscriptions(out);
        }
        catch (std::ios_base::failure& e)
        {
            Log->warn("writer thread {} encountered a ios error: {}", thread_num, e.what());
            disconnection_triggered_ = true;
            break;
        }
    }

    Log->debug("writer {} finished", thread_num);
}